

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<void_(const_pstore::broker::broker_command_&)>::
PerformDefaultAction
          (FunctionMocker<void_(const_pstore::broker::broker_command_&)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<void_(const_pstore::broker::broker_command_&)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<void_(const_pstore::broker::broker_command_&)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  long *local_50 [2];
  long local_40 [2];
  _Head_base<0UL,_const_pstore::broker::broker_command_&,_false> local_30;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar1 = (call_description->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
      std::__cxx11::string::append((char *)local_50);
      if (local_50[0] == local_40) {
        return;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return;
    }
    this_00 = (OnCallSpec<void_(const_pstore::broker::broker_command_&)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<void_(const_pstore::broker::broker_command_&)>::Matches(this_00,args);
  } while (!bVar2);
  this_01 = OnCallSpec<void_(const_pstore::broker::broker_command_&)>::GetAction(this_00);
  local_30._M_head_impl =
       (args->super__Tuple_impl<0UL,_const_pstore::broker::broker_command_&>).
       super__Head_base<0UL,_const_pstore::broker::broker_command_&,_false>._M_head_impl;
  Action<void_(const_pstore::broker::broker_command_&)>::Perform(this_01,(ArgumentTuple *)&local_30)
  ;
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }